

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ublox.c
# Opt level: O2

slReturn ubxSetNMEAData(int fdPort,int verbosity,_Bool nmeaOn)

{
  ubxMsg pollMsg;
  ubxMsg msg;
  _Bool _Var1;
  uint16_t uVar2;
  slReturn pvVar3;
  void *pvVar4;
  slBuffer *body;
  uint64_t uVar5;
  char *pcVar6;
  undefined7 in_register_00000011;
  char *msg_00;
  ubxMsg current;
  ubxMsg local_80;
  ubxMsg poll;
  errorInfo_slReturn local_50;
  
  msg_00 = "off";
  if ((int)CONCAT71(in_register_00000011,nmeaOn) != 0) {
    msg_00 = "on";
  }
  if (2 < verbosity) {
    printf("Querying to see if GPS UART already has NMEA data turned %s...\n",msg_00);
  }
  pvVar3 = isNmeaOn(fdPort);
  _Var1 = isErrorReturn(pvVar3);
  if (!_Var1) {
    pvVar4 = getReturnInfo(pvVar3);
    if ((pvVar4 == (void *)0x0) != nmeaOn) {
      if (2 < verbosity) {
        printf("GPS UART already has NMEA data turned %s...\n",msg_00);
      }
      pvVar3 = makeOkReturn();
      return pvVar3;
    }
    if (2 < verbosity) {
      puts("Polling GPS UART configuration...");
    }
    body = init_slBuffer_int(1,LittleEndian);
    createUbxMsg(&poll,(ubxType)0x6,body);
    pollMsg.body._0_4_ = (int)poll.body;
    pollMsg.type = poll.type;
    pollMsg._2_6_ = poll._2_6_;
    pollMsg.body._4_4_ = (int)((ulong)poll.body >> 0x20);
    pollMsg._16_4_ = poll._16_4_;
    pollMsg._20_4_ = poll._20_4_;
    pvVar3 = pollUbx(fdPort,pollMsg,1000,&current);
    _Var1 = isErrorReturn(pvVar3);
    if (!_Var1) {
      uVar2 = get_uint16_slBuffer(current.body,0xe);
      uVar5 = setBit_slBits((ulong)uVar2,1,nmeaOn);
      put_uint16_slBuffer(current.body,0xe,(uint16_t)uVar5);
      if (2 < verbosity) {
        printf("Sending new configuration to GPS with NMEA data turned %s for the UART...\n",msg_00)
        ;
      }
      createUbxMsg(&local_80,(ubxType)0x6,current.body);
      msg.body._0_4_ = (int)local_80.body;
      msg.type = local_80.type;
      msg._2_6_ = local_80._2_6_;
      msg.body._4_4_ = (int)((ulong)local_80.body >> 0x20);
      msg._16_4_ = local_80._16_4_;
      msg._20_4_ = local_80._20_4_;
      pvVar3 = sendUbxAckedMsg(fdPort,msg);
      _Var1 = isOkReturn(pvVar3);
      if (_Var1) {
        if (0 < verbosity) {
          printf("Successfully set new configuration to turn NMEA data %s for GPS UART...\n",msg_00)
          ;
        }
        pvVar3 = makeOkReturn();
      }
      else {
        if (0 < verbosity) {
          printf("Failed to change GPS UART configuration to turn NMEA data %s...\n",msg_00);
        }
        createErrorInfo(&local_50,
                        "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/ublox.c"
                        ,"ubxSetNMEAData",0x4de,pvVar3);
        pcVar6 = getReturnMsg(pvVar3);
        pvVar3 = makeErrorFmtMsgReturn(0x1141ea,msg_00,pcVar6);
      }
    }
  }
  return pvVar3;
}

Assistant:

extern slReturn ubxSetNMEAData(int fdPort, int verbosity, bool nmeaOn) {

    char* onoff = nmeaOn ? "on" : "off";

    // first we poll for the current configuration...
    if (verbosity >= 3) printf("Querying to see if GPS UART already has NMEA data turned %s...\n", onoff);
    slReturn cn = isNmeaOn(fdPort);
    if (isErrorReturn(cn)) return cn;

    // extract our state information...
    bool currentState = getReturnInfoBool(cn);

    // if we're already in the state we want, just leave...
    if (currentState == nmeaOn) {
        if (verbosity >= 3) printf("GPS UART already has NMEA data turned %s...\n", onoff);
        return makeOkReturn();
    }

    // change the configuration to the way we want it, starting with polling it again...
    if (verbosity >= 3) printf("Polling GPS UART configuration...\n");
    ubxMsg poll = createUbxMsg(ut_CFG_PRT, init_slBuffer(LittleEndian, 1));  // UART is index 1; defines won't work here...
    ubxMsg current;
    slReturn resp = pollUbx(fdPort, poll, CFG_PRT_MAX_MS, &current);
    if (isErrorReturn(resp)) return resp;

    // now change the bit we need to diddle...
    slBuffer *bdy = current.body;
    put_uint16_slBuffer(bdy, 14, (uint16_t) setBit_slBits(get_uint16_slBuffer(bdy, 14), 1, nmeaOn));

    // send out the message to actually make the change...
    if (verbosity >= 3) printf("Sending new configuration to GPS with NMEA data turned %s for the UART...\n", onoff);
    slReturn ackResp = sendUbxAckedMsg(fdPort, createUbxMsg(ut_CFG_PRT, bdy));
    if (isOkReturn(ackResp)) {
        if (verbosity >= 1) printf("Successfully set new configuration to turn NMEA data %s for GPS UART...\n", onoff);
        return makeOkReturn();
    }
    else {
        if (verbosity >= 1) printf("Failed to change GPS UART configuration to turn NMEA data %s...\n", onoff);
        return makeErrorFmtMsgReturn(ERR_CAUSE(ackResp), "failed to change GPS UART configuration to turn NMEA data %s: %s", onoff, getReturnMsg(ackResp));
    }
}